

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

int cmsys::kwsysUnPutEnv(string *env)

{
  int iVar1;
  long lVar2;
  long *extraout_RAX;
  long *plVar3;
  string name;
  long *local_30 [2];
  long local_20 [2];
  
  lVar2 = std::__cxx11::string::find((char)env,0x3d);
  if (lVar2 != -1) {
    std::__cxx11::string::substr((ulong)local_30,(ulong)env);
    unsetenv((char *)local_30[0]);
    plVar3 = local_20;
    if (local_30[0] != plVar3) {
      operator_delete(local_30[0],local_20[0] + 1);
      plVar3 = extraout_RAX;
    }
    return (int)plVar3;
  }
  iVar1 = unsetenv((env->_M_dataplus)._M_p);
  return iVar1;
}

Assistant:

static int kwsysUnPutEnv(const kwsys_stl::string& env)
{
  size_t pos = env.find('=');
  if(pos != env.npos)
    {
    std::string name = env.substr(0, pos);
    unsetenv(name.c_str());
    }
  else
    {
    unsetenv(env.c_str());
    }
  return 0;
}